

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,secp256k1_ecdsa_signature *sig)

{
  undefined8 in_RAX;
  secp256k1_scalar s;
  secp256k1_scalar r;
  undefined8 local_28;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_serialize_compact_cold_3();
  }
  else if (output64 != (uchar *)0x0) {
    if (sig == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_signature_serialize_compact_cold_1();
      return 0;
    }
    local_28 = in_RAX;
    secp256k1_scalar_set_b32((secp256k1_scalar *)((long)&local_28 + 4),sig->data,(int *)0x0);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&local_28,sig->data + 0x20,(int *)0x0);
    secp256k1_scalar_verify((secp256k1_scalar *)((long)&local_28 + 4));
    output64[0x10] = '\0';
    output64[0x11] = '\0';
    output64[0x12] = '\0';
    output64[0x13] = '\0';
    output64[0x14] = '\0';
    output64[0x15] = '\0';
    output64[0x16] = '\0';
    output64[0x17] = '\0';
    output64[0x18] = '\0';
    output64[0x19] = '\0';
    output64[0x1a] = '\0';
    output64[0x1b] = '\0';
    output64[0x1c] = '\0';
    output64[0x1d] = '\0';
    output64[0x1e] = '\0';
    output64[0x1f] = '\0';
    output64[0] = '\0';
    output64[1] = '\0';
    output64[2] = '\0';
    output64[3] = '\0';
    output64[4] = '\0';
    output64[5] = '\0';
    output64[6] = '\0';
    output64[7] = '\0';
    output64[8] = '\0';
    output64[9] = '\0';
    output64[10] = '\0';
    output64[0xb] = '\0';
    output64[0xc] = '\0';
    output64[0xd] = '\0';
    output64[0xe] = '\0';
    output64[0xf] = '\0';
    *(uint *)(output64 + 0x1c) =
         local_28._4_4_ >> 0x18 | (local_28._4_4_ & 0xff0000) >> 8 | (local_28._4_4_ & 0xff00) << 8
         | local_28._4_4_ << 0x18;
    secp256k1_scalar_verify((secp256k1_scalar *)&local_28);
    output64[0x30] = '\0';
    output64[0x31] = '\0';
    output64[0x32] = '\0';
    output64[0x33] = '\0';
    output64[0x34] = '\0';
    output64[0x35] = '\0';
    output64[0x36] = '\0';
    output64[0x37] = '\0';
    output64[0x38] = '\0';
    output64[0x39] = '\0';
    output64[0x3a] = '\0';
    output64[0x3b] = '\0';
    output64[0x3c] = '\0';
    output64[0x3d] = '\0';
    output64[0x3e] = '\0';
    output64[0x3f] = '\0';
    output64[0x20] = '\0';
    output64[0x21] = '\0';
    output64[0x22] = '\0';
    output64[0x23] = '\0';
    output64[0x24] = '\0';
    output64[0x25] = '\0';
    output64[0x26] = '\0';
    output64[0x27] = '\0';
    output64[0x28] = '\0';
    output64[0x29] = '\0';
    output64[0x2a] = '\0';
    output64[0x2b] = '\0';
    output64[0x2c] = '\0';
    output64[0x2d] = '\0';
    output64[0x2e] = '\0';
    output64[0x2f] = '\0';
    *(uint *)(output64 + 0x3c) =
         (uint)local_28 >> 0x18 | ((uint)local_28 & 0xff0000) >> 8 | ((uint)local_28 & 0xff00) << 8
         | (uint)local_28 << 0x18;
    return 1;
  }
  secp256k1_ecdsa_signature_serialize_compact_cold_2();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}